

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O3

int __thiscall QTemporaryFileEngine::open(QTemporaryFileEngine *this,char *__file,int __oflag,...)

{
  byte *pbVar1;
  uint uVar2;
  QAbstractFileEnginePrivate *pQVar3;
  Data *pDVar4;
  QArrayData *data;
  QAbstractFileEngine *pQVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  qsizetype qVar11;
  int *piVar12;
  QTemporaryFileName *this_00;
  FileError FVar13;
  QString *templateName;
  QTemporaryFileName *this_01;
  QTemporaryFileEngine *pQVar14;
  char *pcVar15;
  long in_FS_OFFSET;
  int local_c8;
  ErrorScope local_c4;
  QTemporaryFileName local_a8;
  QFileSystemEntry local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FVar13 = (FileError)__file | FatalError;
  if (this->filePathIsTemplate == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      iVar9 = QFSFileEngine::open(&this->super_QFSFileEngine,(char *)(ulong)FVar13,__oflag);
      return iVar9;
    }
LAB_0025955c:
    __stack_chk_fail();
  }
  pQVar3 = (this->super_QFSFileEngine).super_QAbstractFileEngine.d_ptr.d;
  this_01 = &local_a8;
  local_a8.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.path.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  templateName = this->templateName;
  QTemporaryFileName::QTemporaryFileName(this_01,templateName);
  this_00 = (QTemporaryFileName *)(ulong)this->fileMode;
  if (qt_haveLinuxProcfs()::present == '\0') {
    open((char *)this_01,(int)templateName);
  }
  if (qt_haveLinuxProcfs()::present == '\x01') {
    qVar11 = QByteArray::lastIndexOf(&local_a8.path,'/',-1);
    if (qVar11 < 0) {
      pcVar15 = ".";
    }
    else {
      qVar11 = qVar11 + (ulong)(qVar11 == 0);
      if ((&(local_a8.path.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
      {
        QByteArray::reallocData(&local_a8.path,local_a8.path.d.size,KeepSize);
      }
      local_a8.path.d.ptr[qVar11] = '\0';
      if ((&(local_a8.path.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (pcVar15 = local_a8.path.d.ptr,
         1 < ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData(&local_a8.path,local_a8.path.d.size,KeepSize);
        pcVar15 = local_a8.path.d.ptr;
      }
    }
    do {
      iVar9 = open64(pcVar15,0x490002,this_00);
      if (iVar9 != -1) {
        *(int *)&pQVar3[3].q_ptr = iVar9;
        this->unnamedFile = true;
        QFileSystemEntry::clear((QFileSystemEntry *)(pQVar3 + 1));
        goto LAB_00259444;
      }
      piVar12 = __errno_location();
    } while (*piVar12 == 4);
    *(undefined4 *)&pQVar3[3].q_ptr = 0xffffffff;
    local_c8 = *piVar12;
    if ((local_c8 != 0x5f) && (local_c4 = NativeError, local_c8 != 0x15)) {
LAB_002593df:
      QSystemError::string(&local_78.m_filePath,local_c4,local_c8);
      QAbstractFileEngine::setError((QAbstractFileEngine *)this,OpenError,&local_78.m_filePath);
      if (&(local_78.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
        }
      }
      iVar9 = 0;
LAB_0025945e:
      if (&(local_a8.path.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
           ) {
          QArrayData::deallocate(&(local_a8.path.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return iVar9;
      }
      goto LAB_0025955c;
    }
    if (qVar11 != -1) {
      if ((&(local_a8.path.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_a8.path.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
      {
        QByteArray::reallocData(&local_a8.path,local_a8.path.d.size,KeepSize);
      }
      local_a8.path.d.ptr[qVar11] = '/';
    }
  }
  uVar2 = this->fileMode;
  this_00 = &local_a8;
  local_c4 = NoError;
  local_c8 = 0;
  iVar9 = 0;
  pQVar14 = this;
LAB_00259250:
  QTemporaryFileName::generateNext((NativePath *)&local_78,this_00);
  pcVar15 = (char *)local_78.m_filePath.d.ptr;
  if (local_78.m_filePath.d.ptr == (char16_t *)0x0) {
    pcVar15 = &QByteArray::_empty;
  }
  do {
    iVar10 = open64(pcVar15,0x800c2,(ulong)uVar2);
    if (iVar10 != -1) {
      *(int *)&pQVar3[3].q_ptr = iVar10;
      pQVar14 = (QTemporaryFileEngine *)0x1;
      bVar8 = false;
      goto LAB_002592ca;
    }
    piVar12 = __errno_location();
  } while (*piVar12 == 4);
  *(undefined4 *)&pQVar3[3].q_ptr = 0xffffffff;
  bVar8 = true;
  if (*piVar12 != 0x11) {
    local_c4 = NativeError;
    bVar8 = false;
    pQVar14 = (QTemporaryFileEngine *)0x0;
    local_c8 = *piVar12;
  }
LAB_002592ca:
  if (&(local_78.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (bVar8) goto code_r0x002592f2;
  if (((ulong)pQVar14 & 1) != 0) {
    this->filePathIsTemplate = false;
    this->unnamedFile = false;
    QFileSystemEntry::QFileSystemEntry(&local_78,&local_a8);
    pQVar6 = (QArrayData *)pQVar3[1]._vptr_QAbstractFileEnginePrivate;
    pcVar7 = *(char16_t **)&pQVar3[1].fileError;
    pQVar3[1]._vptr_QAbstractFileEnginePrivate = (_func_int **)local_78.m_filePath.d.d;
    *(char16_t **)&pQVar3[1].fileError = local_78.m_filePath.d.ptr;
    pDVar4 = pQVar3[1].errorString.d.d;
    pQVar3[1].errorString.d.d = (Data *)local_78.m_filePath.d.size;
    data = (QArrayData *)pQVar3[1].errorString.d.ptr;
    pcVar15 = (char *)pQVar3[1].errorString.d.size;
    pQVar3[1].errorString.d.ptr = (char16_t *)local_78.m_nativeFilePath.d.d;
    pQVar3[1].errorString.d.size = (qsizetype)local_78.m_nativeFilePath.d.ptr;
    pQVar5 = pQVar3[1].q_ptr;
    pQVar3[1].q_ptr = (QAbstractFileEngine *)local_78.m_nativeFilePath.d.size;
    *(qint16 *)((long)&pQVar3[2]._vptr_QAbstractFileEnginePrivate + 4) =
         local_78.m_lastDotInFileName;
    *(undefined4 *)&pQVar3[2]._vptr_QAbstractFileEnginePrivate = local_78._48_4_;
    local_78.m_filePath.d.d = (Data *)pQVar6;
    local_78.m_filePath.d.ptr = pcVar7;
    local_78.m_filePath.d.size = (qsizetype)pDVar4;
    local_78.m_nativeFilePath.d.d = (Data *)data;
    local_78.m_nativeFilePath.d.ptr = pcVar15;
    local_78.m_nativeFilePath.d.size = (qsizetype)pQVar5;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,1,0x10);
      }
    }
    if (&(local_78.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_00259444:
    pQVar3[2].fileError = FVar13;
    *(undefined2 *)&pQVar3[4]._vptr_QAbstractFileEnginePrivate = 0x100;
    pbVar1 = (byte *)((long)&pQVar3[4]._vptr_QAbstractFileEnginePrivate + 2);
    *pbVar1 = *pbVar1 & 0xfb;
    iVar9 = (int)CONCAT71((int7)((ulong)this_00 >> 8),1);
    goto LAB_0025945e;
  }
  goto LAB_002593df;
code_r0x002592f2:
  iVar9 = iVar9 + 1;
  if (iVar9 == 0x10) goto LAB_002593df;
  goto LAB_00259250;
}

Assistant:

bool QTemporaryFileEngine::open(QIODevice::OpenMode openMode,
                                std::optional<QFile::Permissions> permissions)
{
    Q_D(QFSFileEngine);
    Q_ASSERT(!isReallyOpen());

    openMode |= QIODevice::ReadWrite;

    if (!filePathIsTemplate)
        return QFSFileEngine::open(openMode, permissions);

    QTemporaryFileName tfn(templateName);

    QSystemError error;
#if defined(Q_OS_WIN)
    NativeFileHandle &file = d->fileHandle;
#else // POSIX
    NativeFileHandle &file = d->fd;
#endif

    CreateUnnamedFileStatus st = createUnnamedFile(file, tfn, fileMode, &error);
    if (st == CreateUnnamedFileStatus::Success) {
        unnamedFile = true;
        d->fileEntry.clear();
    } else if (st == CreateUnnamedFileStatus::NotSupported &&
               createFileFromTemplate(file, tfn, fileMode, flags, error)) {
        filePathIsTemplate = false;
        unnamedFile = false;
        d->fileEntry = QFileSystemEntry(tfn.path, QFileSystemEntry::FromNativePath());
    } else {
        setError(QFile::OpenError, error.toString());
        return false;
    }

#if !defined(Q_OS_WIN)
    d->closeFileHandle = true;
#endif

    d->openMode = openMode;
    d->lastFlushFailed = false;
    d->tried_stat = 0;

    return true;
}